

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *this)

{
  char *pcVar1;
  char cVar2;
  ushort uVar3;
  locale *plVar4;
  basic_format_specs<char> *pbVar5;
  bool bVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  numpunct *pnVar10;
  long lVar11;
  buffer_appender<char> bVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  buffer<char> *buf;
  long *plVar16;
  char *pcVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  char *pcVar21;
  uint uVar22;
  ulong uVar23;
  string groups;
  char digits [40];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  long *local_2a0;
  long local_298;
  long local_290 [2];
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *local_280;
  char local_278 [48];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  plVar4 = (locale *)(this->locale).locale_;
  if (plVar4 == (locale *)0x0) {
    std::locale::locale((locale *)&local_248);
  }
  else {
    std::locale::locale((locale *)&local_248,plVar4);
  }
  pnVar10 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)&local_248);
  (**(code **)(*(long *)pnVar10 + 0x20))(&local_2a0,pnVar10);
  std::locale::~locale((locale *)&local_248);
  if (local_298 == 0) {
    on_dec(this);
  }
  else {
    plVar4 = (locale *)(this->locale).locale_;
    if (plVar4 == (locale *)0x0) {
      std::locale::locale((locale *)&local_248);
    }
    else {
      std::locale::locale((locale *)&local_248,plVar4);
    }
    pnVar10 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)&local_248);
    cVar8 = (**(code **)(*(long *)pnVar10 + 0x18))(pnVar10);
    std::locale::~locale((locale *)&local_248);
    if (cVar8 != '\0') {
      uVar15 = this->abs_value;
      uVar3 = *(ushort *)(bsr2log10(int)::data + (ulong)((uint)LZCOUNT(uVar15 | 1) ^ 0x3f) * 2);
      bVar7 = uVar15 < *(ulong *)(basic_data<void>::zero_or_powers_of_10_64_new + (ulong)uVar3 * 8);
      uVar22 = (uint)uVar3 - (uint)bVar7;
      uVar19 = uVar22;
      uVar14 = uVar22;
      if (local_298 != 0) {
        uVar19 = uVar22 + (int)local_298;
        lVar11 = 0;
        uVar13 = uVar22;
        do {
          cVar2 = *(char *)((long)local_2a0 + lVar11);
          uVar14 = uVar13 - (int)cVar2;
          if ((uVar14 == 0 || (int)uVar13 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) {
            iVar9 = (int)lVar11 + uVar22;
            goto LAB_001276f0;
          }
          lVar11 = lVar11 + 1;
          uVar13 = uVar14;
        } while (local_298 != lVar11);
      }
      iVar9 = (int)(uVar14 - 1) / (int)*(char *)((long)local_2a0 + local_298 + -1) + uVar19;
LAB_001276f0:
      pcVar17 = local_278 + (int)uVar22;
      uVar18 = uVar15;
      pcVar21 = pcVar17;
      if (99 < uVar15) {
        do {
          pcVar17 = pcVar21 + -2;
          uVar15 = uVar18 / 100;
          *(undefined2 *)(pcVar21 + -2) =
               *(undefined2 *)(basic_data<void>::digits + (uVar18 % 100) * 2);
          bVar6 = 9999 < uVar18;
          uVar18 = uVar15;
          pcVar21 = pcVar17;
        } while (bVar6);
      }
      if (uVar15 < 10) {
        pcVar17[-1] = (byte)uVar15 | 0x30;
      }
      else {
        *(undefined2 *)(pcVar17 + -2) = *(undefined2 *)(basic_data<void>::digits + uVar15 * 2);
      }
      local_248.super_buffer<char>.size_ = 0;
      local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_00799960;
      local_248.super_buffer<char>.ptr_ = local_248.store_;
      local_248.super_buffer<char>.capacity_ = 500;
      uVar19 = iVar9 + this->prefix_size;
      if (-1 < (int)uVar19) {
        uVar15 = (ulong)uVar19;
        if (500 < uVar19) {
          basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,uVar15);
        }
        pcVar21 = local_248.super_buffer<char>.ptr_;
        pcVar17 = local_248.super_buffer<char>.ptr_ + (uVar15 - 1);
        local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
        if (uVar15 <= local_248.super_buffer<char>.capacity_) {
          local_248.super_buffer<char>.size_ = uVar15;
        }
        if (1 < (int)uVar22) {
          uVar18 = (ulong)uVar22;
          iVar9 = 0;
          iVar20 = (1 - (uint)bVar7) + (uint)uVar3;
          plVar16 = local_2a0;
          do {
            uVar18 = uVar18 - 1;
            pcVar1 = pcVar17 + -1;
            *pcVar17 = local_278[uVar18 & 0xffffffff];
            cVar2 = (char)*plVar16;
            if ('\0' < cVar2) {
              iVar9 = iVar9 + 1;
              if ((cVar2 != '\x7f') && (iVar9 % (int)cVar2 == 0)) {
                pcVar17[-1] = cVar8;
                if ((long *)((long)plVar16 + 1) != (long *)((long)local_2a0 + local_298)) {
                  iVar9 = 0;
                  plVar16 = (long *)((long)plVar16 + 1);
                }
                pcVar1 = pcVar17 + -2;
              }
            }
            pcVar17 = pcVar1;
            iVar20 = iVar20 + -1;
          } while (2 < iVar20);
        }
        *pcVar17 = local_278[0];
        if (this->prefix_size != 0) {
          pcVar17[-1] = '-';
        }
        pbVar5 = this->specs;
        uVar18 = (ulong)pbVar5->width;
        if (-1 < (long)uVar18) {
          bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
               (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
               (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
          uVar23 = 0;
          if (uVar15 <= uVar18) {
            uVar23 = uVar18 - uVar15;
          }
          cVar8 = *(char *)((long)&basic_data<void>::right_padding_shifts +
                           (ulong)((byte)pbVar5->field_0x9 & 0xf));
          local_280 = this;
          if (*(ulong *)((long)bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                               container + 0x18) <
              *(long *)((long)bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10) + uVar15 + (pbVar5->fill).size_ * uVar23) {
            (*(code *)**(undefined8 **)
                        bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                      (bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
          }
          uVar18 = uVar23 >> ((long)cVar8 & 0x3fU);
          bVar12 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar12,uVar18,&pbVar5->fill);
          bVar12 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                   __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                             (pcVar21,pcVar21 + uVar15,bVar12);
          bVar12 = fill<fmt::v7::detail::buffer_appender<char>,char>
                             (bVar12,uVar23 - uVar18,&pbVar5->fill);
          (local_280->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
               (buffer<char> *)
               bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
          if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
            operator_delete(local_248.super_buffer<char>.ptr_,local_248.super_buffer<char>.capacity_
                           );
          }
          goto LAB_00127919;
        }
      }
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/core.h"
                  ,0x146,"negative value");
    }
    on_dec(this);
  }
LAB_00127919:
  if (local_2a0 != local_290) {
    operator_delete(local_2a0,local_290[0] + 1);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }